

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::NoLocations::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 310 es                \nlayout (location=0) out mediump vec4 a;            \nlayout (location=1) out mediump vec4 b;            \nlayout (location=2) out mediump vec4 c;            \nlayout (location=3) out mediump vec4 d[1];         \nvoid main() {                  \n    a = vec4(0, 1, 0, 1);      \n    b = vec4(0, 1, 0, 1);      \n    c = vec4(0, 1, 0, 1);      \n    d[0] = vec4(0, 1, 0, 1);   \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                \n"
			   "layout (location=0) out mediump vec4 a;            \n"
			   "layout (location=1) out mediump vec4 b;            \n"
			   "layout (location=2) out mediump vec4 c;            \n"
			   "layout (location=3) out mediump vec4 d[1];         \n"
			   "void main() {                  \n"
			   "    a = vec4(0, 1, 0, 1);      \n"
			   "    b = vec4(0, 1, 0, 1);      \n"
			   "    c = vec4(0, 1, 0, 1);      \n"
			   "    d[0] = vec4(0, 1, 0, 1);   \n"
			   "}";
	}